

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice_plane.cpp
# Opt level: O0

void __thiscall polyscope::SlicePlane::buildGUI(SlicePlane *this)

{
  float fVar1;
  float _y;
  bool bVar2;
  reference pvVar3;
  float *pfVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  long in_RDI;
  double dVar5;
  undefined1 auVar7 [56];
  vec3 vVar8;
  ImGuiColorEditFlags in_stack_0000003c;
  float *in_stack_00000040;
  char *in_stack_00000048;
  string vMeshName;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::Structure,_std::default_delete<polyscope::Structure>_>_>
  *it;
  iterator __end3;
  iterator __begin3;
  mapped_type *__range3;
  bool haveVolumeMeshes;
  array<float,_4UL> color;
  float transparencyBefore;
  vec3 colorBefore;
  ImVec2 *in_stack_fffffffffffffe28;
  allocator *paVar9;
  SlicePlane *in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe3c;
  undefined4 in_stack_fffffffffffffe40;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 in_stack_fffffffffffffe44;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  key_type *__k;
  anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9 *in_stack_fffffffffffffe70;
  allocator local_159;
  string local_158 [32];
  string *in_stack_fffffffffffffec8;
  SlicePlane *in_stack_fffffffffffffed0;
  undefined1 local_118 [40];
  _Self local_f0;
  undefined1 local_e8 [15];
  undefined1 local_d9 [33];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b8;
  ImVec2 local_b0;
  _Self local_a8;
  undefined8 in_stack_ffffffffffffff60;
  undefined8 in_stack_ffffffffffffff68;
  undefined1 local_89 [33];
  _Self local_68 [2];
  size_type local_58;
  undefined1 local_50 [16];
  anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3 local_40;
  anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9 local_3c;
  anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9 local_38;
  anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9 local_34;
  anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3 local_30;
  anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3 local_2c;
  undefined8 local_28;
  anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9 local_20;
  anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9 local_14;
  anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9 aStack_10;
  anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9 local_c;
  undefined1 auVar6 [64];
  
  std::__cxx11::string::c_str();
  ImGui::PushID((char *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
  std::__cxx11::string::c_str();
  PersistentValue<bool>::get((PersistentValue<bool> *)(in_RDI + 0x40));
  bVar2 = ImGui::Checkbox((char *)in_stack_ffffffffffffff68,(bool *)in_stack_ffffffffffffff60);
  if (bVar2) {
    getActive((SlicePlane *)0x45ef43);
    setActive(in_stack_fffffffffffffe30,SUB81((ulong)in_stack_fffffffffffffe28 >> 0x38,0));
  }
  auVar7 = SUB6456(ZEXT1664((undefined1  [16])0x0),8);
  ImGui::SameLine((float)((ulong)in_stack_fffffffffffffe30 >> 0x20),
                  SUB84(in_stack_fffffffffffffe30,0));
  vVar8 = getColor(in_stack_fffffffffffffe30);
  local_20 = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)vVar8.field_2;
  auVar6._0_8_ = vVar8._0_8_;
  auVar6._8_56_ = auVar7;
  local_28 = vmovlpd_avx(auVar6._0_16_);
  _local_14 = local_28;
  local_c = local_20;
  dVar5 = getTransparency((SlicePlane *)0x45efa8);
  local_30.x = (float)dVar5;
  local_3c = local_14;
  local_38 = aStack_10;
  local_34 = local_c;
  local_2c.x = local_30.x;
  std::array<float,_4UL>::operator[]
            ((array<float,_4UL> *)in_stack_fffffffffffffe30,(size_type)in_stack_fffffffffffffe28);
  bVar2 = ImGui::ColorEdit4(in_stack_00000048,in_stack_00000040,in_stack_0000003c);
  if (!bVar2) goto LAB_0045f1ce;
  pvVar3 = std::array<float,_4UL>::operator[]
                     ((array<float,_4UL> *)in_stack_fffffffffffffe30,
                      (size_type)in_stack_fffffffffffffe28);
  fVar1 = *pvVar3;
  pfVar4 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                     ((vec<3,_float,_(glm::qualifier)0> *)&local_14,0);
  if ((fVar1 != *pfVar4) || (NAN(fVar1) || NAN(*pfVar4))) {
LAB_0045f0e4:
    in_stack_fffffffffffffe70 = &local_3c;
    pvVar3 = std::array<float,_4UL>::operator[]
                       ((array<float,_4UL> *)in_stack_fffffffffffffe30,
                        (size_type)in_stack_fffffffffffffe28);
    fVar1 = *pvVar3;
    pvVar3 = std::array<float,_4UL>::operator[]
                       ((array<float,_4UL> *)in_stack_fffffffffffffe30,
                        (size_type)in_stack_fffffffffffffe28);
    _y = *pvVar3;
    pvVar3 = std::array<float,_4UL>::operator[]
                       ((array<float,_4UL> *)in_stack_fffffffffffffe30,
                        (size_type)in_stack_fffffffffffffe28);
    glm::vec<3,_float,_(glm::qualifier)0>::vec
              ((vec<3,_float,_(glm::qualifier)0> *)(local_50 + 8),fVar1,_y,*pvVar3);
    local_50._0_4_ = local_40;
    local_58 = local_50._8_8_;
    vVar8.field_1 =
         (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)in_stack_fffffffffffffe40;
    vVar8.field_0 =
         (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)in_stack_fffffffffffffe3c;
    vVar8.field_2.z = in_stack_fffffffffffffe44.z;
    setColor((SlicePlane *)0x45f183,vVar8);
  }
  else {
    pvVar3 = std::array<float,_4UL>::operator[]
                       ((array<float,_4UL> *)in_stack_fffffffffffffe30,
                        (size_type)in_stack_fffffffffffffe28);
    fVar1 = *pvVar3;
    pfVar4 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                       ((vec<3,_float,_(glm::qualifier)0> *)&local_14,1);
    if ((fVar1 != *pfVar4) || (NAN(fVar1) || NAN(*pfVar4))) goto LAB_0045f0e4;
    pvVar3 = std::array<float,_4UL>::operator[]
                       ((array<float,_4UL> *)in_stack_fffffffffffffe30,
                        (size_type)in_stack_fffffffffffffe28);
    fVar1 = *pvVar3;
    pfVar4 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                       ((vec<3,_float,_(glm::qualifier)0> *)&local_14,2);
    if ((fVar1 != *pfVar4) || (NAN(fVar1) || NAN(*pfVar4))) goto LAB_0045f0e4;
  }
  pvVar3 = std::array<float,_4UL>::operator[]
                     ((array<float,_4UL> *)in_stack_fffffffffffffe30,
                      (size_type)in_stack_fffffffffffffe28);
  if ((*pvVar3 != local_2c.x) || (NAN(*pvVar3) || NAN(local_2c.x))) {
    std::array<float,_4UL>::operator[]
              ((array<float,_4UL> *)in_stack_fffffffffffffe30,(size_type)in_stack_fffffffffffffe28);
    setTransparency(in_stack_fffffffffffffe30,(double)in_stack_fffffffffffffe28);
  }
LAB_0045f1ce:
  ImGui::Indent(in_stack_fffffffffffffe44.z);
  PersistentValue<bool>::get((PersistentValue<bool> *)(in_RDI + 0x68));
  bVar2 = ImGui::Checkbox((char *)in_stack_ffffffffffffff68,(bool *)in_stack_ffffffffffffff60);
  if (bVar2) {
    getDrawPlane((SlicePlane *)0x45f208);
    setDrawPlane(in_stack_fffffffffffffe30,SUB81((ulong)in_stack_fffffffffffffe28 >> 0x38,0));
  }
  ImGui::SameLine((float)((ulong)in_stack_fffffffffffffe30 >> 0x20),
                  SUB84(in_stack_fffffffffffffe30,0));
  PersistentValue<bool>::get((PersistentValue<bool> *)(in_RDI + 0x90));
  bVar2 = ImGui::Checkbox((char *)in_stack_ffffffffffffff68,(bool *)in_stack_ffffffffffffff60);
  if (bVar2) {
    getDrawWidget((SlicePlane *)0x45f259);
    setDrawWidget(in_stack_fffffffffffffe30,SUB81((ulong)in_stack_fffffffffffffe28 >> 0x38,0));
  }
  __k = (key_type *)local_89;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_89 + 1),"Volume Mesh",(allocator *)__k);
  local_68[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::Structure,_std::default_delete<polyscope::Structure>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::Structure,_std::default_delete<polyscope::Structure>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::Structure,_std::default_delete<polyscope::Structure>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::Structure,_std::default_delete<polyscope::Structure>_>_>_>_>_>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::Structure,_std::default_delete<polyscope::Structure>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::Structure,_std::default_delete<polyscope::Structure>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::Structure,_std::default_delete<polyscope::Structure>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::Structure,_std::default_delete<polyscope::Structure>_>_>_>_>_>_>_>
               *)in_stack_fffffffffffffe28,(key_type *)0x45f2aa);
  local_a8._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::Structure,_std::default_delete<polyscope::Structure>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::Structure,_std::default_delete<polyscope::Structure>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::Structure,_std::default_delete<polyscope::Structure>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::Structure,_std::default_delete<polyscope::Structure>_>_>_>_>_>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::Structure,_std::default_delete<polyscope::Structure>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::Structure,_std::default_delete<polyscope::Structure>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::Structure,_std::default_delete<polyscope::Structure>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::Structure,_std::default_delete<polyscope::Structure>_>_>_>_>_>_>_>
              *)in_stack_fffffffffffffe28);
  bVar2 = std::operator!=(local_68,&local_a8);
  std::__cxx11::string::~string((string *)(local_89 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_89);
  local_68[1]._M_node._7_1_ = bVar2;
  if (bVar2) {
    ImVec2::ImVec2(&local_b0,0.0,0.0);
    bVar2 = ImGui::Button((char *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
    if (bVar2) {
      ImGui::OpenPopup((char *)in_stack_fffffffffffffe30,
                       (ImGuiPopupFlags)((ulong)in_stack_fffffffffffffe28 >> 0x20));
    }
    bVar2 = ImGui::BeginPopup((char *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                              (ImGuiWindowFlags)((ulong)in_stack_fffffffffffffe30 >> 0x20));
    if (bVar2) {
      __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)(local_d9 + 1),"Volume Mesh",(allocator *)__lhs);
      __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::Structure,_std::default_delete<polyscope::Structure>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::Structure,_std::default_delete<polyscope::Structure>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::Structure,_std::default_delete<polyscope::Structure>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::Structure,_std::default_delete<polyscope::Structure>_>_>_>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::Structure,_std::default_delete<polyscope::Structure>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::Structure,_std::default_delete<polyscope::Structure>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::Structure,_std::default_delete<polyscope::Structure>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::Structure,_std::default_delete<polyscope::Structure>_>_>_>_>_>_>_>
                            *)in_stack_fffffffffffffe70,__k);
      std::__cxx11::string::~string((string *)(local_d9 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_d9);
      local_b8 = __rhs;
      local_e8._0_8_ =
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::Structure,_std::default_delete<polyscope::Structure>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::Structure,_std::default_delete<polyscope::Structure>_>_>_>_>
           ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::Structure,_std::default_delete<polyscope::Structure>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::Structure,_std::default_delete<polyscope::Structure>_>_>_>_>
                    *)in_stack_fffffffffffffe28);
      local_f0._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::Structure,_std::default_delete<polyscope::Structure>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::Structure,_std::default_delete<polyscope::Structure>_>_>_>_>
           ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::Structure,_std::default_delete<polyscope::Structure>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::Structure,_std::default_delete<polyscope::Structure>_>_>_>_>
                  *)in_stack_fffffffffffffe28);
      while (bVar2 = std::operator!=((_Self *)local_e8,&local_f0), bVar2) {
        local_118._32_8_ =
             std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::Structure,_std::default_delete<polyscope::Structure>_>_>_>
             ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::Structure,_std::default_delete<polyscope::Structure>_>_>_>
                          *)0x45f483);
        in_stack_fffffffffffffe30 = (SlicePlane *)local_118;
        std::__cxx11::string::string((string *)in_stack_fffffffffffffe30,(string *)local_118._32_8_)
        ;
        std::__cxx11::string::c_str();
        std::operator==(__lhs,__rhs);
        bVar2 = ImGui::MenuItem((char *)in_stack_fffffffffffffe30,(char *)in_stack_fffffffffffffe28,
                                false,false);
        in_stack_fffffffffffffe44._3_1_ = bVar2;
        if (bVar2) {
          std::__cxx11::string::string((string *)&stack0xfffffffffffffec8,(string *)local_118);
          setVolumeMeshToInspect(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
          std::__cxx11::string::~string((string *)&stack0xfffffffffffffec8);
        }
        std::__cxx11::string::~string((string *)local_118);
        std::
        _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::Structure,_std::default_delete<polyscope::Structure>_>_>_>
        ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::Structure,_std::default_delete<polyscope::Structure>_>_>_>
                      *)in_stack_fffffffffffffe30);
      }
      std::operator==(&in_stack_fffffffffffffe30->name,(char *)in_stack_fffffffffffffe28);
      bVar2 = ImGui::MenuItem((char *)in_stack_fffffffffffffe30,(char *)in_stack_fffffffffffffe28,
                              false,false);
      if (bVar2) {
        paVar9 = &local_159;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_158,"",paVar9);
        setVolumeMeshToInspect(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
        std::__cxx11::string::~string(local_158);
        std::allocator<char>::~allocator((allocator<char> *)&local_159);
      }
      ImGui::EndPopup();
    }
  }
  ImGui::Unindent(in_stack_fffffffffffffe44.z);
  ImGui::PopID();
  return;
}

Assistant:

void SlicePlane::buildGUI() {
  ImGui::PushID(name.c_str());

  if (ImGui::Checkbox(name.c_str(), &active.get())) {
    setActive(getActive());
  }

  ImGui::SameLine();

  { // Color transparency box
    // Pack the color & transparency in to a vec4
    glm::vec3 colorBefore = getColor();
    float transparencyBefore = getTransparency();
    std::array<float, 4> color{colorBefore.x, colorBefore.y, colorBefore.z, transparencyBefore};
    if (ImGui::ColorEdit4("##color and trans", &color[0], ImGuiColorEditFlags_NoInputs)) {
      if (color[0] != colorBefore[0] || color[1] != colorBefore[1] || color[2] != colorBefore[2]) {
        setColor(glm::vec3{color[0], color[1], color[2]});
      }
      if (color[3] != transparencyBefore) {
        setTransparency(color[3]);
      }
    }
  }

  ImGui::Indent(16.);
  if (ImGui::Checkbox("draw plane", &drawPlane.get())) {
    setDrawPlane(getDrawPlane());
  }
  ImGui::SameLine();
  if (ImGui::Checkbox("draw widget", &drawWidget.get())) {
    setDrawWidget(getDrawWidget());
  }

  bool haveVolumeMeshes = state::structures.find("Volume Mesh") != state::structures.end();

  if (haveVolumeMeshes) {

    if (ImGui::Button("Inspect")) {
      ImGui::OpenPopup("InspectPopup");
    }
    if (ImGui::BeginPopup("InspectPopup")) {

      //  Loop over volume meshes and offer them to be inspected
      for (std::pair<const std::string, std::unique_ptr<Structure>>& it : state::structures["Volume Mesh"]) {
        std::string vMeshName = it.first;
        if (ImGui::MenuItem(vMeshName.c_str(), NULL, inspectedMeshName == vMeshName)) {
          setVolumeMeshToInspect(vMeshName);
        }
      }

      // "None" option
      if (ImGui::MenuItem("None", NULL, inspectedMeshName == "")) {
        setVolumeMeshToInspect("");
      }

      ImGui::EndPopup();
    }
  }


  ImGui::Unindent(16.);

  ImGui::PopID();
}